

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Vrc6_Apu.cpp
# Opt level: O2

void __thiscall Nes_Vrc6_Apu::load_state(Nes_Vrc6_Apu *this,vrc6_apu_state_t *in)

{
  int i;
  long lVar1;
  vrc6_apu_state_t *pvVar2;
  Nes_Vrc6_Apu *pNVar3;
  long lVar4;
  
  reset(this);
  this->oscs[2].amp = (uint)in->saw_amp;
  pvVar2 = in;
  pNVar3 = this;
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
      pNVar3->oscs[0].regs[lVar4] = pvVar2->regs[0][lVar4];
    }
    this->oscs[lVar1].delay = (uint)in->delays[lVar1];
    this->oscs[lVar1].phase = (uint)in->phases[lVar1];
    pNVar3 = (Nes_Vrc6_Apu *)(pNVar3->oscs + 1);
    pvVar2 = (vrc6_apu_state_t *)(pvVar2->regs + 1);
  }
  if (this->oscs[2].phase == 0) {
    this->oscs[2].phase = 1;
  }
  return;
}

Assistant:

void Nes_Vrc6_Apu::load_state( vrc6_apu_state_t const& in )
{
	reset();
	oscs [2].amp = in.saw_amp;
	for ( int i = 0; i < osc_count; i++ )
	{
		Vrc6_Osc& osc = oscs [i];
		for ( int r = 0; r < reg_count; r++ )
			osc.regs [r] = in.regs [i] [r];
		
		osc.delay = in.delays [i];
		osc.phase = in.phases [i];
	}
	if ( !oscs [2].phase )
		oscs [2].phase = 1;
}